

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int nghttp2_frame_unpack_altsvc_payload2
              (nghttp2_extension *frame,uint8_t *payload,size_t payloadlen,nghttp2_mem *mem)

{
  undefined8 *puVar1;
  uint16_t uVar2;
  int iVar3;
  uint8_t *dest;
  size_t size;
  ulong uVar4;
  
  if (payloadlen < 2) {
    return 6;
  }
  uVar2 = nghttp2_get_uint16(payload);
  size = payloadlen - 2;
  dest = (uint8_t *)nghttp2_mem_malloc(mem,size);
  if (dest == (uint8_t *)0x0) {
    iVar3 = -0x385;
  }
  else {
    uVar4 = (ulong)uVar2;
    nghttp2_cpymem(dest,payload + 2,size);
    puVar1 = (undefined8 *)frame->payload;
    *puVar1 = dest;
    puVar1[1] = uVar4;
    puVar1[2] = dest + uVar4;
    puVar1[3] = size - uVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int nghttp2_frame_unpack_altsvc_payload2(nghttp2_extension *frame,
                                         const uint8_t *payload,
                                         size_t payloadlen, nghttp2_mem *mem) {
  uint8_t *buf;
  size_t origin_len;

  if (payloadlen < 2) {
    return NGHTTP2_FRAME_SIZE_ERROR;
  }

  origin_len = nghttp2_get_uint16(payload);

  buf = nghttp2_mem_malloc(mem, payloadlen - 2);
  if (!buf) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_cpymem(buf, payload + 2, payloadlen - 2);

  nghttp2_frame_unpack_altsvc_payload(frame, origin_len, buf, payloadlen - 2);

  return 0;
}